

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateHashCodeCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_65 [13];
  LogMessage local_58;
  JavaType local_1c;
  Printer *pPStack_18;
  JavaType java_type;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  local_1c = GetJavaType(this->descriptor_);
  if (local_1c == JAVATYPE_BYTES) {
    io::Printer::Print(pPStack_18,&this->variables_,
                       "result = 31 * result + java.util.Arrays.hashCode(this.$name$);\n");
  }
  else if ((local_1c == JAVATYPE_STRING) ||
          (bVar1 = Params::use_reference_types_for_primitives((this->super_FieldGenerator).params_),
          bVar1)) {
    io::Printer::Print(pPStack_18,&this->variables_,
                       "result = 31 * result\n    + (this.$name$ == null ? 0 : this.$name$.hashCode());\n"
                      );
  }
  else {
    switch(local_1c) {
    case JAVATYPE_INT:
      io::Printer::Print(pPStack_18,&this->variables_,"result = 31 * result + this.$name$;\n");
      break;
    case JAVATYPE_LONG:
      io::Printer::Print(pPStack_18,&this->variables_,
                         "result = 31 * result\n    + (int) (this.$name$ ^ (this.$name$ >>> 32));\n"
                        );
      break;
    case JAVATYPE_FLOAT:
      io::Printer::Print(pPStack_18,&this->variables_,
                         "result = 31 * result\n    + java.lang.Float.floatToIntBits(this.$name$);\n"
                        );
      break;
    case JAVATYPE_DOUBLE:
      io::Printer::Print(pPStack_18,&this->variables_,
                         "{\n  long v = java.lang.Double.doubleToLongBits(this.$name$);\n  result = 31 * result + (int) (v ^ (v >>> 32));\n}\n"
                        );
      break;
    case JAVATYPE_BOOLEAN:
      io::Printer::Print(pPStack_18,&this->variables_,
                         "result = 31 * result + (this.$name$ ? 1231 : 1237);\n");
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_primitive_field.cc"
                 ,0x1f1);
      other = internal::LogMessage::operator<<(&local_58,"unknown java type for primitive field");
      internal::LogFinisher::operator=(local_65,other);
      internal::LogMessage::~LogMessage(&local_58);
    }
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateHashCodeCode(io::Printer* printer) const {
  JavaType java_type = GetJavaType(descriptor_);
  if (java_type == JAVATYPE_BYTES) {
    printer->Print(variables_,
      "result = 31 * result + java.util.Arrays.hashCode(this.$name$);\n");
  } else if (java_type == JAVATYPE_STRING
      || params_.use_reference_types_for_primitives()) {
    printer->Print(variables_,
      "result = 31 * result\n"
      "    + (this.$name$ == null ? 0 : this.$name$.hashCode());\n");
  } else {
    switch (java_type) {
      // For all Java primitive types below, the hash codes match the
      // results of BoxedType.valueOf(primitiveValue).hashCode().
      case JAVATYPE_INT:
        printer->Print(variables_,
          "result = 31 * result + this.$name$;\n");
        break;
      case JAVATYPE_LONG:
        printer->Print(variables_,
          "result = 31 * result\n"
          "    + (int) (this.$name$ ^ (this.$name$ >>> 32));\n");
        break;
      case JAVATYPE_FLOAT:
        printer->Print(variables_,
          "result = 31 * result\n"
          "    + java.lang.Float.floatToIntBits(this.$name$);\n");
        break;
      case JAVATYPE_DOUBLE:
        printer->Print(variables_,
          "{\n"
          "  long v = java.lang.Double.doubleToLongBits(this.$name$);\n"
          "  result = 31 * result + (int) (v ^ (v >>> 32));\n"
          "}\n");
        break;
      case JAVATYPE_BOOLEAN:
        printer->Print(variables_,
          "result = 31 * result + (this.$name$ ? 1231 : 1237);\n");
        break;
      default:
        GOOGLE_LOG(ERROR) << "unknown java type for primitive field";
        break;
    }
  }
}